

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

bool __thiscall bloaty::anon_unknown_0::IsObjectFile(anon_unknown_0 *this,string_view data)

{
  bool bVar1;
  string_view data_00;
  ElfFile elf;
  ElfFile local_110;
  
  data_00._M_str = (char *)data._M_len;
  data_00._M_len = (size_t)this;
  ElfFile::ElfFile(&local_110,data_00);
  if ((anon_unknown_0 *)0x7 < this) {
    if (*(long *)data._M_len == 0xa3e686372613c21) {
      bVar1 = true;
    }
    else if (local_110.ok_ == true) {
      bVar1 = local_110.header_.e_type == 1;
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  Throw("region out-of-bounds",0x5d);
}

Assistant:

static bool IsObjectFile(string_view data) {
  ElfFile elf(data);
  return IsArchiveFile(data) || (elf.IsOpen() && elf.header().e_type == ET_REL);
}